

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_lcl.c
# Opt level: O3

void beltPolyMul(word *c,word *a,word *b,void *stack)

{
  ppMul((word *)stack,a,2,b,2,(void *)((long)stack + 0x20));
  ppRedBelt((word *)stack);
  wwCopy(c,(word *)stack,2);
  return;
}

Assistant:

void beltPolyMul(word c[], const word a[], const word b[], void* stack)
{
	const size_t n = W_OF_B(128);
	word* prod = (word*)stack;
	stack = prod + 2 * n;
	// умножить
	ppMul(prod, a, n, b, n, stack);
	// привести по модулю
	ppRedBelt(prod);
	wwCopy(c, prod, n);
}